

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

size_t readUTF8Char(uint8_t *dest,char *src)

{
  uint32_t uVar1;
  size_t local_30;
  size_t i;
  uint32_t codep;
  uint32_t state;
  char *src_local;
  uint8_t *dest_local;
  
  i._4_4_ = 0;
  local_30 = 0;
  _codep = src;
  src_local = (char *)dest;
  do {
    uVar1 = decode((uint32_t *)((long)&i + 4),(uint32_t *)&i,_codep[local_30]);
    if (uVar1 == 1) {
      return 0;
    }
    if (src_local != (char *)0x0) {
      src_local[local_30] = _codep[local_30];
    }
    local_30 = local_30 + 1;
  } while (i._4_4_ != 0);
  return local_30;
}

Assistant:

size_t readUTF8Char(uint8_t *dest, char const *src)
{
	uint32_t state = 0;
	uint32_t codep;
	size_t i = 0;

	for (;;) {
		if (decode(&state, &codep, src[i]) == 1)
			return 0;

		if (dest)
			dest[i] = src[i];
		i++;

		if (state == 0)
			return i;
	}
}